

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLstack.c
# Opt level: O0

void RDL_stack_push(RDL_stack *stack,void *element)

{
  void **ppvVar1;
  void **ppvVar2;
  void **ppvVar3;
  uint distance;
  void *element_local;
  RDL_stack *stack_local;
  
  if (stack->size == stack->reserved) {
    stack->reserved = stack->reserved << 1;
    ppvVar1 = stack->top;
    ppvVar2 = stack->elements;
    ppvVar3 = (void **)realloc(stack->elements,(ulong)stack->reserved << 3);
    stack->elements = ppvVar3;
    stack->top = stack->elements + ((long)ppvVar1 - (long)ppvVar2 >> 3 & 0xffffffff);
  }
  stack->top = stack->top + 1;
  stack->size = stack->size + 1;
  *stack->top = element;
  return;
}

Assistant:

void RDL_stack_push(RDL_stack* stack, void* element)
{
  unsigned distance;

  if (stack->size == stack->reserved) {
    stack->reserved *= 2;

    distance = stack->top - stack->elements;

    stack->elements = realloc(stack->elements,
        stack->reserved * sizeof(*stack->elements));

    stack->top = stack->elements + distance;
  }
  ++stack->top;
  ++stack->size;
  *stack->top = element;
}